

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O1

bool __thiscall
wasm::ExpressionAnalyzer::flexibleEqual(wasm::Expression*,wasm::Expression*,std::function<bool(wasm
::Expression*,wasm::Expression*)>)::Comparer::compareNodes(wasm::Expression*,wasm::Expression__
          (void *this,Expression *left,Expression *right)

{
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar1;
  _Base_ptr this_00;
  undefined8 *puVar2;
  Id IVar3;
  Id IVar4;
  iterator iVar5;
  uintptr_t uVar6;
  uintptr_t uVar7;
  bool bVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  Expression *pEVar12;
  uint uVar13;
  ulong uVar14;
  char cVar15;
  ulong uVar16;
  ulong uVar17;
  uintptr_t uVar18;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar19;
  bool bVar20;
  uintptr_t local_50;
  _Base_ptr p_Stack_48;
  Expression *child;
  _Base_ptr local_38;
  
  IVar3 = left->_id;
  IVar4 = right->_id;
  if (IVar3 != IVar4) {
    return false;
  }
  switch(IVar3) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    if ((IVar3 == BlockId) && (IVar4 == BlockId)) {
      uVar18 = left[2].type.id;
      if (uVar18 != right[2].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[2].type.id;
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
LAB_006a9d72:
      if ((right[1].type.id != 0) != (left[1].type.id != 0)) {
        return false;
      }
      pmVar10 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)(left + 1));
      pcVar11 = (char *)right[1].type.id;
      (pmVar10->super_IString).str._M_len = *(size_t *)(right + 1);
      (pmVar10->super_IString).str._M_str = pcVar11;
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Block]";
    break;
  case IfId:
    if ((IVar3 != IfId) || (IVar4 != IfId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::If]";
      break;
    }
    goto LAB_006aa4ea;
  case LoopId:
    if ((IVar3 == LoopId) && (IVar4 == LoopId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 2));
      goto LAB_006a9d72;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Loop]";
    break;
  case BreakId:
    if ((IVar3 == BreakId) && (IVar4 == BreakId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 2));
LAB_006a97bd:
      p_Stack_48 = *(_Base_ptr *)(left + 1);
      child = (Expression *)left[1].type.id;
      pEVar12 = (Expression *)right[1].type.id;
      iVar9 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)this,(key_type *)&stack0xffffffffffffffb8);
      if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
        child = (Expression *)iVar9._M_node[1]._M_right;
      }
      if (child != pEVar12) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Break]";
    break;
  case SwitchId:
    if ((IVar3 == SwitchId) && (IVar4 == SwitchId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[4].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[4].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 4));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 4));
      p_Stack_48 = *(_Base_ptr *)(left + 3);
      child = (Expression *)left[3].type.id;
      pEVar12 = (Expression *)right[3].type.id;
      iVar9 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      *)this,(key_type *)&stack0xffffffffffffffb8);
      local_38 = (_Base_ptr)((long)this + 8);
      if (iVar9._M_node != local_38) {
        p_Stack_48 = iVar9._M_node[1]._M_left;
        child = (Expression *)iVar9._M_node[1]._M_right;
      }
      if (child != pEVar12) {
        return false;
      }
      if (left[1].type.id != right[1].type.id) {
        return false;
      }
      bVar20 = left[1].type.id != 0;
      if (!bVar20) {
        return true;
      }
      uVar17 = 0;
      uVar16 = 1;
      while (uVar17 < right[1].type.id) {
        puVar2 = (undefined8 *)(*(long *)(left + 1) + uVar17 * 0x10);
        p_Stack_48 = (_Base_ptr)*puVar2;
        child = (Expression *)puVar2[1];
        pEVar12 = *(Expression **)(*(long *)(right + 1) + 8 + uVar17 * 0x10);
        iVar9 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                        *)this,(key_type *)&stack0xffffffffffffffb8);
        if (iVar9._M_node != local_38) {
          p_Stack_48 = iVar9._M_node[1]._M_left;
          child = (Expression *)iVar9._M_node[1]._M_right;
        }
        if (child != pEVar12) {
          if (bVar20) {
            return false;
          }
          return true;
        }
        uVar17 = left[1].type.id;
        bVar20 = uVar16 < uVar17;
        bVar8 = uVar17 <= uVar16;
        uVar17 = uVar16;
        uVar16 = (ulong)((int)uVar16 + 1);
        if (bVar8) {
          return true;
        }
      }
LAB_006aae90:
      pcVar11 = 
      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
      ;
      goto LAB_006aae6f;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Switch]";
    break;
  case CallId:
    if ((IVar3 == CallId) && (IVar4 == CallId)) {
      uVar18 = left[1].type.id;
      if (uVar18 != right[1].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[1].type.id;
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      if (left[3].type.id != right[3].type.id) {
        return false;
      }
      if (left[4]._id != right[4]._id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Call]";
    break;
  case CallIndirectId:
    if ((IVar3 == CallIndirectId) && (IVar4 == CallIndirectId)) {
      this_00 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this_00,
                 (value_type *)&left[3].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[3].type);
      if (left[4].type.id != right[4].type.id) {
        return false;
      }
      uVar17 = *(ulong *)(left + 2);
      if (uVar17 != *(ulong *)(right + 2)) {
        return false;
      }
      local_38 = this_00;
      if (uVar17 != 0) {
        uVar16 = 0;
        do {
          if (*(ulong *)(left + 2) <= uVar16) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(left[1].type.id + uVar16 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      uVar17 = *(ulong *)(right + 2);
      if (uVar17 != 0) {
        uVar16 = 0;
        do {
          if (*(ulong *)(right + 2) <= uVar16) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(right[1].type.id + uVar16 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar16 = uVar16 + 1;
        } while (uVar17 != uVar16);
      }
      if (*(long *)(left + 1) != *(long *)(right + 1)) {
        return false;
      }
      if (left[5]._id != right[5]._id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
    break;
  case LocalGetId:
    if ((IVar3 != LocalGetId) || (IVar4 != LocalGetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      break;
    }
    goto LAB_006aa1e3;
  case LocalSetId:
    if ((IVar3 != LocalSetId) || (IVar4 != LocalSetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      break;
    }
    goto LAB_006a975e;
  case GlobalGetId:
    if ((IVar3 != GlobalGetId) || (IVar4 != GlobalGetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      break;
    }
    goto LAB_006aa187;
  case GlobalSetId:
    if ((IVar3 != GlobalSetId) || (IVar4 != GlobalSetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      break;
    }
    goto LAB_006a9bbd;
  case LoadId:
    if ((IVar3 != LoadId) || (IVar4 != LoadId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Load]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    if (left[1]._id != right[1]._id) {
      return false;
    }
    if (left[1].field_0x1 != right[1].field_0x1) {
      return false;
    }
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    if (*(long *)(left + 2) != *(long *)(right + 2)) {
      return false;
    }
    if ((char)left[2].type.id != (char)right[2].type.id) {
      return false;
    }
    goto LAB_006aa350;
  case StoreId:
    if ((IVar3 == StoreId) && (IVar4 == StoreId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[3].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[3].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 3));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 3));
      if (left[1]._id != right[1]._id) {
        return false;
      }
      if (left[1].type.id != right[1].type.id) {
        return false;
      }
      if (*(long *)(left + 2) != *(long *)(right + 2)) {
        return false;
      }
      if ((char)left[2].type.id != (char)right[2].type.id) {
        return false;
      }
      if (*(long *)(left + 4) != *(long *)(right + 4)) {
        return false;
      }
      if (*(long *)(left + 5) != *(long *)(right + 5)) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Store]";
    break;
  case ConstId:
    if ((IVar3 == ConstId) && (IVar4 == ConstId)) {
      bVar20 = Literal::operator!=((Literal *)(left + 1),(Literal *)(right + 1));
      if (bVar20) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Const]";
    break;
  case UnaryId:
    if ((IVar3 != UnaryId) || (IVar4 != UnaryId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Unary]";
      break;
    }
LAB_006a975e:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006aa1d7:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
LAB_006aa1e3:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    return true;
  case BinaryId:
    if ((IVar3 != BinaryId) || (IVar4 != BinaryId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Binary]";
      break;
    }
    goto LAB_006aa1ab;
  case SelectId:
    if ((IVar3 != SelectId) || (IVar4 != SelectId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Select]";
      break;
    }
    goto LAB_006aa4ea;
  case DropId:
    if ((IVar3 != DropId) || (IVar4 != DropId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Drop]";
      break;
    }
    goto LAB_006a9ebf;
  case ReturnId:
    if ((IVar3 != ReturnId) || (IVar4 != ReturnId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Return]";
      break;
    }
    goto LAB_006a9ebf;
  case MemorySizeId:
    if ((IVar3 == MemorySizeId) && (IVar4 == MemorySizeId)) goto LAB_006aa187;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
    break;
  case MemoryGrowId:
    if ((IVar3 == MemoryGrowId) && (IVar4 == MemoryGrowId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 1));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 1));
      if (*(long *)(left + 2) != *(long *)(right + 2)) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
    break;
  case NopId:
    if ((IVar3 == NopId) && (IVar4 == NopId)) {
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Nop]";
    break;
  case UnreachableId:
    if ((IVar3 == UnreachableId) && (IVar4 == UnreachableId)) {
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
    break;
  case AtomicRMWId:
    if ((IVar3 == AtomicRMWId) && (IVar4 == AtomicRMWId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 2));
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      if (left[1].field_0x4 != right[1].field_0x4) {
        return false;
      }
      if (left[1].type.id != right[1].type.id) {
        return false;
      }
LAB_006aa0ec:
      if (left[3].type.id != right[3].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
    break;
  case AtomicCmpxchgId:
    if ((IVar3 != AtomicCmpxchgId) || (IVar4 != AtomicCmpxchgId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      break;
    }
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 2));
    if (left[1]._id != right[1]._id) {
      return false;
    }
    goto LAB_006aa342;
  case AtomicWaitId:
    if ((IVar3 == AtomicWaitId) && (IVar4 == AtomicWaitId)) {
      pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[2].type);
      pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                ((long)this + 0x48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)&right[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)(right + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)&right[1].type);
      if (*(long *)(left + 1) != *(long *)(right + 1)) {
        return false;
      }
      if (*(long *)(left + 3) != *(long *)(right + 3)) {
        return false;
      }
      goto LAB_006aa350;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
    break;
  case AtomicNotifyId:
    if ((IVar3 != AtomicNotifyId) || (IVar4 != AtomicNotifyId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    if (*(long *)(left + 1) != *(long *)(right + 1)) {
      return false;
    }
    goto LAB_006aa3d2;
  case AtomicFenceId:
    if ((IVar3 == AtomicFenceId) && (IVar4 == AtomicFenceId)) {
      if (left[1]._id != right[1]._id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
    break;
  case SIMDExtractId:
    if ((IVar3 != SIMDExtractId) || (IVar4 != SIMDExtractId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006a8f67;
  case SIMDReplaceId:
    if ((IVar3 != SIMDReplaceId) || (IVar4 != SIMDReplaceId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006a8f67:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
LAB_006a8f80:
    if (left[2]._id != right[2]._id) {
      return false;
    }
    return true;
  case SIMDShuffleId:
    if ((IVar3 == SIMDShuffleId) && (IVar4 == SIMDShuffleId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 1));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 1));
      if (left[2]._id != right[2]._id) {
        return false;
      }
      uVar17 = 0;
      do {
        uVar16 = uVar17;
        if (uVar16 == 0xf) {
          return true;
        }
        uVar17 = uVar16 + 1;
      } while ((&left[2].field_0x1)[uVar16] == (&right[2].field_0x1)[uVar16]);
      if (uVar16 < 0xf) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
    break;
  case SIMDTernaryId:
    if ((IVar3 != SIMDTernaryId) || (IVar4 != SIMDTernaryId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006aa1bf;
  case SIMDShiftId:
    if ((IVar3 != SIMDShiftId) || (IVar4 != SIMDShiftId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      break;
    }
LAB_006aa1ab:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006aa1bf:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006aa1d7;
  case SIMDLoadId:
    if ((IVar3 == SIMDLoadId) && (IVar4 == SIMDLoadId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[2].type);
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      if (left[1].type.id != right[1].type.id) {
        return false;
      }
      if (*(long *)(left + 2) != *(long *)(right + 2)) {
        return false;
      }
      goto LAB_006aa0ec;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
    break;
  case SIMDLoadStoreLaneId:
    if ((IVar3 == SIMDLoadStoreLaneId) && (IVar4 == SIMDLoadStoreLaneId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[3].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[3].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 3));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 3));
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      if (left[1].type.id != right[1].type.id) {
        return false;
      }
      if (*(long *)(left + 2) != *(long *)(right + 2)) {
        return false;
      }
      if ((char)left[2].type.id != (char)right[2].type.id) {
        return false;
      }
      if (left[4].type.id != right[4].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
    break;
  case MemoryInitId:
    if ((IVar3 != MemoryInitId) || (IVar4 != MemoryInitId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      break;
    }
    goto LAB_006aa2f2;
  case DataDropId:
    if ((IVar3 == DataDropId) && (IVar4 == DataDropId)) goto LAB_006aa187;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
    break;
  case MemoryCopyId:
    if ((IVar3 != MemoryCopyId) || (IVar4 != MemoryCopyId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      break;
    }
    goto LAB_006aa374;
  case MemoryFillId:
    if ((IVar3 == MemoryFillId) && (IVar4 == MemoryFillId)) {
      pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)(left + 2));
      pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                ((long)this + 0x48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)(right + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)&right[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)(left + 1));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)(right + 1));
      goto LAB_006aa3d2;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
    break;
  case PopId:
    if ((IVar3 == PopId) && (IVar4 == PopId)) {
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Pop]";
    break;
  case RefNullId:
    if ((IVar3 == RefNullId) && (IVar4 == RefNullId)) {
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefNull]";
    break;
  case RefIsNullId:
    if ((IVar3 != RefIsNullId) || (IVar4 != RefIsNullId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      break;
    }
    goto LAB_006a9ebf;
  case RefFuncId:
    if ((IVar3 == RefFuncId) && (IVar4 == RefFuncId)) goto LAB_006aa187;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
    break;
  case RefEqId:
    if ((IVar3 != RefEqId) || (IVar4 != RefEqId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      break;
    }
    goto LAB_006aa4c0;
  case TableGetId:
    if ((IVar3 != TableGetId) || (IVar4 != TableGetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      break;
    }
LAB_006a9bbd:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006aa17b:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
LAB_006aa187:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    return true;
  case TableSetId:
    if ((IVar3 != TableSetId) || (IVar4 != TableSetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      break;
    }
    goto LAB_006aa110;
  case TableSizeId:
    if ((IVar3 == TableSizeId) && (IVar4 == TableSizeId)) goto LAB_006aa187;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableSize]";
    break;
  case TableGrowId:
    if ((IVar3 != TableGrowId) || (IVar4 != TableGrowId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      break;
    }
LAB_006aa110:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
LAB_006aa163:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006aa17b;
  case TableFillId:
    if ((IVar3 != TableFillId) || (IVar4 != TableFillId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    goto LAB_006aa163;
  case TableCopyId:
    if ((IVar3 != TableCopyId) || (IVar4 != TableCopyId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      break;
    }
LAB_006aa374:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 1));
    if (*(long *)(left + 4) != *(long *)(right + 4)) {
      return false;
    }
LAB_006aa3d2:
    if (*(long *)(left + 3) != *(long *)(right + 3)) {
      return false;
    }
    return true;
  case TableInitId:
    if ((IVar3 != TableInitId) || (IVar4 != TableInitId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      break;
    }
LAB_006aa2f2:
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x48)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar19,(value_type *)(right + 2));
LAB_006aa342:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
LAB_006aa350:
    if (*(long *)(left + 4) != *(long *)(right + 4)) {
      return false;
    }
    return true;
  case TryId:
    if ((IVar3 != TryId) || (IVar4 != TryId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Try]";
      break;
    }
    p_Stack_48 = (_Base_ptr)left[6].type.id;
    child = *(Expression **)(left + 7);
    pEVar12 = *(Expression **)(right + 7);
    iVar9 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
      p_Stack_48 = iVar9._M_node[1]._M_left;
      child = (Expression *)iVar9._M_node[1]._M_right;
    }
    cVar15 = '\x01';
    if ((child != pEVar12) || (uVar17 = *(ulong *)(left + 5), uVar17 != *(ulong *)(right + 5)))
    goto LAB_006aad1b;
    if (uVar17 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      uVar16 = 0;
      do {
        if (*(ulong *)(left + 5) <= uVar16) goto LAB_006aae5a;
        p_Stack_48 = *(_Base_ptr *)(left[4].type.id + uVar16 * 8);
        iVar5._M_current = *(Expression ***)((long)this + 0x38);
        if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar5._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
        }
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    uVar17 = *(ulong *)(right + 5);
    if (uVar17 != 0) {
      local_38 = (_Base_ptr)((long)this + 0x48);
      uVar16 = 0;
      do {
        if (*(ulong *)(right + 5) <= uVar16) goto LAB_006aae5a;
        p_Stack_48 = *(_Base_ptr *)(right[4].type.id + uVar16 * 8);
        iVar5._M_current = *(Expression ***)((long)this + 0x50);
        if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5,
                     (Expression **)&stack0xffffffffffffffb8);
        }
        else {
          *iVar5._M_current = (Expression *)p_Stack_48;
          *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
        }
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    uVar17 = *(ulong *)(left + 3);
    if (uVar17 == *(ulong *)(right + 3)) {
      cVar15 = '\x19';
      bVar20 = uVar17 != 0;
      if (bVar20) {
        uVar13 = 1;
        uVar16 = 0;
        do {
          if (*(ulong *)(right + 3) <= uVar16) goto LAB_006aae90;
          if (*(long *)(left[2].type.id + 8 + uVar16 * 0x10) !=
              *(long *)(right[2].type.id + 8 + uVar16 * 0x10)) {
            cVar15 = '\x01';
            break;
          }
          uVar16 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          bVar20 = uVar16 < uVar17;
        } while (uVar16 < uVar17);
      }
      if ((bVar20) || (cVar15 = '\x01', (right[1].type.id != 0) != (left[1].type.id != 0)))
      goto LAB_006aad1b;
      pmVar10 = std::
                map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)(left + 1));
      pcVar11 = (char *)right[1].type.id;
      (pmVar10->super_IString).str._M_len = *(size_t *)(right + 1);
      (pmVar10->super_IString).str._M_str = pcVar11;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 2));
      pEVar12 = right + 2;
LAB_006aacab:
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)pEVar12);
LAB_006aacb6:
      cVar15 = '\x02';
      goto LAB_006aad1b;
    }
    goto LAB_006aad15;
  case TryTableId:
    if ((IVar3 != TryTableId) || (IVar4 != TryTableId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      break;
    }
    uVar17 = *(ulong *)(left + 8);
    if (uVar17 == *(ulong *)(right + 8)) {
      cVar15 = '\x1c';
      bVar20 = uVar17 != 0;
      if (bVar20) {
        uVar13 = 1;
        uVar16 = 0;
        do {
          if (*(ulong *)(right + 8) <= uVar16) goto LAB_006aae79;
          if (*(long *)(left[7].type.id + uVar16 * 8) != *(long *)(right[7].type.id + uVar16 * 8)) {
            cVar15 = '\x01';
            break;
          }
          uVar16 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          bVar20 = uVar16 < uVar17;
        } while (uVar16 < uVar17);
      }
      if (bVar20) goto LAB_006aad1b;
      uVar17 = *(ulong *)(left + 6);
      if (uVar17 == *(ulong *)(right + 6)) {
        cVar15 = '\x1f';
        bVar20 = uVar17 != 0;
        if (bVar20) {
          uVar13 = 1;
          uVar16 = 0;
          do {
            if (*(ulong *)(right + 6) <= uVar16) {
              pcVar11 = 
              "T &ArenaVectorBase<ArenaVector<bool>, bool>::operator[](size_t) const [SubType = ArenaVector<bool>, T = bool]"
              ;
              goto LAB_006aae6f;
            }
            if (*(char *)(left[5].type.id + uVar16) != *(char *)(right[5].type.id + uVar16)) {
              cVar15 = '\x01';
              break;
            }
            uVar16 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            bVar20 = uVar16 < uVar17;
          } while (uVar16 < uVar17);
        }
        if (bVar20) goto LAB_006aad1b;
        if (*(long *)(left + 4) == *(long *)(right + 4)) {
          bVar20 = *(long *)(left + 4) != 0;
          if (bVar20) {
            uVar17 = 0;
            uVar16 = 1;
            do {
              if (*(ulong *)(right + 4) <= uVar17) goto LAB_006aae90;
              puVar2 = (undefined8 *)(left[3].type.id + uVar17 * 0x10);
              p_Stack_48 = (_Base_ptr)*puVar2;
              child = (Expression *)puVar2[1];
              local_38 = *(_Base_ptr *)(right[3].type.id + 8 + uVar17 * 0x10);
              iVar9 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)&stack0xffffffffffffffb8);
              if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
                p_Stack_48 = iVar9._M_node[1]._M_left;
                child = (Expression *)iVar9._M_node[1]._M_right;
              }
              if ((_Base_ptr)child != local_38) {
                cVar15 = '\x01';
                goto LAB_006aada3;
              }
              bVar20 = uVar16 < *(ulong *)(left + 4);
              bVar8 = uVar16 < *(ulong *)(left + 4);
              uVar17 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar8);
          }
          cVar15 = '\"';
LAB_006aada3:
          if (bVar20) goto LAB_006aad1b;
          uVar17 = *(ulong *)(left + 2);
          cVar15 = '\x01';
          if (uVar17 != *(ulong *)(right + 2)) goto LAB_006aad1b;
          cVar15 = '%';
          bVar20 = uVar17 != 0;
          if (bVar20) {
            uVar13 = 1;
            uVar16 = 0;
            do {
              if (*(ulong *)(right + 2) <= uVar16) goto LAB_006aae90;
              if (*(long *)(left[1].type.id + 8 + uVar16 * 0x10) !=
                  *(long *)(right[1].type.id + 8 + uVar16 * 0x10)) {
                cVar15 = '\x01';
                break;
              }
              uVar16 = (ulong)uVar13;
              uVar13 = uVar13 + 1;
              bVar20 = uVar16 < uVar17;
            } while (uVar16 < uVar17);
          }
          if (bVar20) goto LAB_006aad1b;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                    ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                     ((long)this + 0x30),(value_type *)(left + 1));
          pEVar12 = right + 1;
          goto LAB_006aacab;
        }
      }
    }
    goto LAB_006aad15;
  case ThrowId:
    if ((IVar3 == ThrowId) && (IVar4 == ThrowId)) {
      uVar18 = left[2].type.id;
      if (uVar18 != right[2].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[2].type.id;
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      goto LAB_006aa187;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Throw]";
    break;
  case RethrowId:
    if ((IVar3 == RethrowId) && (IVar4 == RethrowId)) goto LAB_006a97bd;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
    break;
  case ThrowRefId:
    if ((IVar3 != ThrowRefId) || (IVar4 != ThrowRefId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      break;
    }
    goto LAB_006a9ebf;
  case TupleMakeId:
    if ((IVar3 == TupleMakeId) && (IVar4 == TupleMakeId)) {
      uVar18 = left[1].type.id;
      local_50 = right[1].type.id;
      if (uVar18 != local_50) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar6 = right[1].type.id;
      if (uVar6 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
LAB_006aa846:
      if (uVar18 != local_50) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
    break;
  case TupleExtractId:
    if ((IVar3 == TupleExtractId) && (IVar4 == TupleExtractId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 1));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 1));
      if ((int)left[1].type.id != (int)right[1].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
    break;
  case RefI31Id:
    if ((IVar3 != RefI31Id) || (IVar4 != RefI31Id)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      break;
    }
    goto LAB_006a9ebf;
  case I31GetId:
    if ((IVar3 == I31GetId) && (IVar4 == I31GetId)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 1));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 1));
      if ((char)left[1].type.id != (char)right[1].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::I31Get]";
    break;
  case CallRefId:
    if ((IVar3 == CallRefId) && (IVar4 == CallRefId)) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 3));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 3));
      uVar18 = left[1].type.id;
      if (uVar18 != right[1].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[1].type.id;
      if (uVar18 != 0) {
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      if ((char)left[3].type.id != (char)right[3].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::CallRef]";
    break;
  case RefTestId:
    if ((IVar3 != RefTestId) || (IVar4 != RefTestId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      break;
    }
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    goto LAB_006a9ebf;
  case RefCastId:
    if ((IVar3 != RefCastId) || (IVar4 != RefCastId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      break;
    }
    goto LAB_006a9ebf;
  case BrOnId:
    if ((IVar3 != BrOnId) || (IVar4 != BrOnId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      break;
    }
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    p_Stack_48 = (_Base_ptr)left[1].type.id;
    child = *(Expression **)(left + 2);
    pEVar12 = *(Expression **)(right + 2);
    iVar9 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    *)this,(key_type *)&stack0xffffffffffffffb8);
    if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
      p_Stack_48 = iVar9._M_node[1]._M_left;
      child = (Expression *)iVar9._M_node[1]._M_right;
    }
    if (child != pEVar12) {
      return false;
    }
    if (*(long *)(left + 3) != *(long *)(right + 3)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    pEVar12 = (Expression *)&right[2].type;
    goto LAB_006aa606;
  case StructNewId:
    if ((IVar3 == StructNewId) && (IVar4 == StructNewId)) {
      uVar18 = left[1].type.id;
      local_50 = right[1].type.id;
      if (uVar18 != local_50) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar6 = right[1].type.id;
      if (uVar6 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
      goto LAB_006aa846;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StructNew]";
    break;
  case StructGetId:
    if ((IVar3 == StructGetId) && (IVar4 == StructGetId)) {
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[1].type);
      if (left[2]._id != right[2]._id) {
        return false;
      }
      if (*(int *)&left[2].field_0x4 != *(int *)&right[2].field_0x4) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StructGet]";
    break;
  case StructSetId:
    if ((IVar3 == StructSetId) && (IVar4 == StructSetId)) {
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
LAB_006a9b22:
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x30),(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)&right[1].type);
      if ((int)left[2].type.id != (int)right[2].type.id) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StructSet]";
    break;
  case StructRMWId:
    if ((IVar3 == StructRMWId) && (IVar4 == StructRMWId)) {
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      if (*(int *)&left[1].field_0x4 != *(int *)&right[1].field_0x4) {
        return false;
      }
      goto LAB_006a9b22;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
    break;
  case StructCmpxchgId:
    if ((IVar3 == StructCmpxchgId) && (IVar4 == StructCmpxchgId)) {
      if (*(int *)(left + 1) != *(int *)(right + 1)) {
        return false;
      }
      pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[2].type);
      pvVar19 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                ((long)this + 0x48);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)&right[2].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)(left + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)(right + 2));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar1,(value_type *)&left[1].type);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                (pvVar19,(value_type *)&right[1].type);
      if (*(int *)(left + 3) != *(int *)(right + 3)) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
    break;
  case ArrayNewId:
    if ((IVar3 != ArrayNewId) || (IVar4 != ArrayNewId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      break;
    }
    goto LAB_006aa4c0;
  case ArrayNewDataId:
    if ((IVar3 != ArrayNewDataId) || (IVar4 != ArrayNewDataId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      break;
    }
    goto LAB_006a98d3;
  case ArrayNewElemId:
    if ((IVar3 != ArrayNewElemId) || (IVar4 != ArrayNewElemId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      break;
    }
LAB_006a98d3:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
LAB_006a98f5:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    pEVar12 = right + 2;
    goto LAB_006aa606;
  case ArrayNewFixedId:
    if ((IVar3 == ArrayNewFixedId) && (IVar4 == ArrayNewFixedId)) {
      uVar18 = left[1].type.id;
      local_50 = right[1].type.id;
      if (uVar18 != local_50) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar6 = right[1].type.id;
      if (uVar6 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar6 != uVar17);
      }
      goto LAB_006aa846;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
    break;
  case ArrayGetId:
    if ((IVar3 != ArrayGetId) || (IVar4 != ArrayGetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 1));
    goto LAB_006a8f80;
  case ArraySetId:
    if ((IVar3 != ArraySetId) || (IVar4 != ArraySetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      break;
    }
    goto LAB_006aa4ea;
  case ArrayLenId:
    if ((IVar3 != ArrayLenId) || (IVar4 != ArrayLenId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      break;
    }
    goto LAB_006a9ebf;
  case ArrayCopyId:
    if ((IVar3 != ArrayCopyId) || (IVar4 != ArrayCopyId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    goto LAB_006aa5b7;
  case ArrayFillId:
    if ((IVar3 != ArrayFillId) || (IVar4 != ArrayFillId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      break;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
LAB_006aa5b7:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006aa5cf;
  case ArrayInitDataId:
    if ((IVar3 != ArrayInitDataId) || (IVar4 != ArrayInitDataId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      break;
    }
    goto LAB_006a929a;
  case ArrayInitElemId:
    if ((IVar3 != ArrayInitElemId) || (IVar4 != ArrayInitElemId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      break;
    }
LAB_006a929a:
    if (left[1].type.id != right[1].type.id) {
      return false;
    }
    pvVar1 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)((long)this + 0x30);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[3].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)(left + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 3));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pvVar1,(value_type *)&left[2].type);
    goto LAB_006a98f5;
  case RefAsId:
    if ((IVar3 != RefAsId) || (IVar4 != RefAsId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      break;
    }
    goto LAB_006aa2bb;
  case StringNewId:
    if ((IVar3 != StringNewId) || (IVar4 != StringNewId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      break;
    }
    goto LAB_006aa6fa;
  case StringConstId:
    if ((IVar3 == StringConstId) && (IVar4 == StringConstId)) goto LAB_006aa187;
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringConst]";
    break;
  case StringMeasureId:
    if ((IVar3 != StringMeasureId) || (IVar4 != StringMeasureId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      break;
    }
LAB_006aa2bb:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006aa74e:
    pEVar12 = (Expression *)&right[1].type;
    goto LAB_006aa606;
  case StringEncodeId:
    if ((IVar3 != StringEncodeId) || (IVar4 != StringEncodeId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      break;
    }
LAB_006aa6fa:
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[2].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006aa733:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006aa74e;
  case StringConcatId:
    if ((IVar3 != StringConcatId) || (IVar4 != StringConcatId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      break;
    }
    goto LAB_006aa4c0;
  case StringEqId:
    if ((IVar3 != StringEqId) || (IVar4 != StringEqId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      break;
    }
    if (*(int *)(left + 1) != *(int *)(right + 1)) {
      return false;
    }
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
    goto LAB_006aa733;
  case StringWTF16GetId:
    if ((IVar3 != StringWTF16GetId) || (IVar4 != StringWTF16GetId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      break;
    }
LAB_006aa4c0:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
    goto LAB_006aa5e7;
  case StringSliceWTFId:
    if ((IVar3 != StringSliceWTFId) || (IVar4 != StringSliceWTFId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      break;
    }
LAB_006aa4ea:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 2));
LAB_006aa5cf:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)(right + 2));
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)&left[1].type);
LAB_006aa5e7:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)&right[1].type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
    goto LAB_006aa602;
  case ContNewId:
    if ((IVar3 != ContNewId) || (IVar4 != ContNewId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      break;
    }
LAB_006a9ebf:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x30),(value_type *)(left + 1));
LAB_006aa602:
    pEVar12 = right + 1;
LAB_006aa606:
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)this + 0x48),(value_type *)pEVar12);
    return true;
  case ContBindId:
    if ((IVar3 == ContBindId) && (IVar4 == ContBindId)) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 3));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 3));
      uVar18 = left[1].type.id;
      uVar6 = right[1].type.id;
      if (uVar18 != uVar6) {
        return false;
      }
      if (uVar18 != 0) {
        uVar17 = 0;
        do {
          if (left[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar7 = right[1].type.id;
      if (uVar7 != 0) {
        uVar17 = 0;
        do {
          if (right[1].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 1) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar7 != uVar17);
      }
      if (uVar18 != uVar6) {
        return false;
      }
      return true;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::ContBind]";
    break;
  case SuspendId:
    if ((IVar3 == SuspendId) && (IVar4 == SuspendId)) {
      uVar18 = left[2].type.id;
      if (uVar18 != right[2].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x30);
        uVar17 = 0;
        do {
          if (left[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[2].type.id;
      if (uVar18 != 0) {
        local_38 = (_Base_ptr)((long)this + 0x48);
        uVar17 = 0;
        do {
          if (right[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      goto LAB_006aa187;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::Suspend]";
    break;
  case ResumeId:
    if ((IVar3 != ResumeId) || (IVar4 != ResumeId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::Resume]";
      break;
    }
    uVar17 = *(ulong *)(left + 8);
    if (uVar17 == *(ulong *)(right + 8)) {
      cVar15 = 'D';
      bVar20 = uVar17 != 0;
      if (bVar20) {
        uVar13 = 1;
        uVar16 = 0;
        do {
          if (*(ulong *)(right + 8) <= uVar16) goto LAB_006aae79;
          if (*(long *)(left[7].type.id + uVar16 * 8) != *(long *)(right[7].type.id + uVar16 * 8)) {
            cVar15 = '\x01';
            break;
          }
          uVar16 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          bVar20 = uVar16 < uVar17;
        } while (uVar16 < uVar17);
      }
      if (bVar20) goto LAB_006aad1b;
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 7));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 7));
      uVar18 = left[5].type.id;
      if (uVar18 == right[5].type.id) {
        if (uVar18 != 0) {
          uVar17 = 0;
          do {
            if (left[5].type.id <= uVar17) goto LAB_006aae5a;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 5) + uVar17 * 8);
            iVar5._M_current = *(Expression ***)((long)this + 0x38);
            if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,
                         iVar5,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar5._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
            }
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        uVar18 = right[5].type.id;
        if (uVar18 != 0) {
          uVar17 = 0;
          do {
            if (right[5].type.id <= uVar17) goto LAB_006aae5a;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 5) + uVar17 * 8);
            iVar5._M_current = *(Expression ***)((long)this + 0x50);
            if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar5._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
            }
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        if (left[3].type.id == right[3].type.id) {
          bVar20 = left[3].type.id != 0;
          cVar15 = 'K';
          if (bVar20) {
            uVar17 = 0;
            uVar16 = 1;
            do {
              if (right[3].type.id <= uVar17) goto LAB_006aae90;
              puVar2 = (undefined8 *)(*(long *)(left + 3) + uVar17 * 0x10);
              p_Stack_48 = (_Base_ptr)*puVar2;
              child = (Expression *)puVar2[1];
              local_38 = *(_Base_ptr *)(*(long *)(right + 3) + 8 + uVar17 * 0x10);
              iVar9 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)&stack0xffffffffffffffb8);
              if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
                p_Stack_48 = iVar9._M_node[1]._M_left;
                child = (Expression *)iVar9._M_node[1]._M_right;
              }
              if ((_Base_ptr)child != local_38) {
                cVar15 = '\x01';
                goto LAB_006aacc4;
              }
              uVar17 = left[3].type.id;
              bVar20 = uVar16 < uVar17;
              bVar8 = uVar16 < uVar17;
              uVar17 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar8);
            cVar15 = 'K';
          }
LAB_006aacc4:
          if (bVar20) goto LAB_006aad1b;
          uVar17 = left[1].type.id;
          uVar16 = right[1].type.id;
          cVar15 = '\x01';
          if (uVar17 != uVar16) goto LAB_006aad1b;
          if (uVar17 != 0) {
            uVar13 = 1;
            uVar14 = 0;
            do {
              if (uVar16 <= uVar14) goto LAB_006aae90;
              if (*(long *)(*(long *)(left + 1) + 8 + uVar14 * 0x10) !=
                  *(long *)(*(long *)(right + 1) + 8 + uVar14 * 0x10)) goto LAB_006aad15;
              uVar14 = (ulong)uVar13;
              uVar13 = uVar13 + 1;
            } while (uVar14 < uVar17);
          }
          goto LAB_006aacb6;
        }
      }
    }
    goto LAB_006aad15;
  case ResumeThrowId:
    if ((IVar3 != ResumeThrowId) || (IVar4 != ResumeThrowId)) {
      pcVar11 = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      break;
    }
    uVar17 = *(ulong *)(left + 9);
    if (uVar17 == *(ulong *)(right + 9)) {
      cVar15 = 'Q';
      bVar20 = uVar17 != 0;
      if (bVar20) {
        uVar13 = 1;
        uVar16 = 0;
        do {
          if (*(ulong *)(right + 9) <= uVar16) goto LAB_006aae79;
          if (*(long *)(left[8].type.id + uVar16 * 8) != *(long *)(right[8].type.id + uVar16 * 8)) {
            cVar15 = '\x01';
            break;
          }
          uVar16 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
          bVar20 = uVar16 < uVar17;
        } while (uVar16 < uVar17);
      }
      if (bVar20) goto LAB_006aad1b;
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 8));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 8));
      uVar18 = left[6].type.id;
      if (uVar18 == right[6].type.id) {
        if (uVar18 != 0) {
          uVar17 = 0;
          do {
            if (left[6].type.id <= uVar17) goto LAB_006aae5a;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 6) + uVar17 * 8);
            iVar5._M_current = *(Expression ***)((long)this + 0x38);
            if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,
                         iVar5,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar5._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
            }
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        uVar18 = right[6].type.id;
        if (uVar18 != 0) {
          uVar17 = 0;
          do {
            if (right[6].type.id <= uVar17) goto LAB_006aae5a;
            p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 6) + uVar17 * 8);
            iVar5._M_current = *(Expression ***)((long)this + 0x50);
            if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
            }
            else {
              *iVar5._M_current = (Expression *)p_Stack_48;
              *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
            }
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        if (left[4].type.id == right[4].type.id) {
          bVar20 = left[4].type.id != 0;
          cVar15 = 'X';
          if (bVar20) {
            uVar17 = 0;
            uVar16 = 1;
            do {
              if (right[4].type.id <= uVar17) goto LAB_006aae90;
              puVar2 = (undefined8 *)(*(long *)(left + 4) + uVar17 * 0x10);
              p_Stack_48 = (_Base_ptr)*puVar2;
              child = (Expression *)puVar2[1];
              local_38 = *(_Base_ptr *)(*(long *)(right + 4) + 8 + uVar17 * 0x10);
              iVar9 = std::
                      _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                      ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                              *)this,(key_type *)&stack0xffffffffffffffb8);
              if (iVar9._M_node != (_Base_ptr)((long)this + 8)) {
                p_Stack_48 = iVar9._M_node[1]._M_left;
                child = (Expression *)iVar9._M_node[1]._M_right;
              }
              if ((_Base_ptr)child != local_38) {
                cVar15 = '\x01';
                goto LAB_006aad3c;
              }
              uVar17 = left[4].type.id;
              bVar20 = uVar16 < uVar17;
              bVar8 = uVar16 < uVar17;
              uVar17 = uVar16;
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (bVar8);
            cVar15 = 'X';
          }
LAB_006aad3c:
          if (!bVar20) {
            uVar17 = left[2].type.id;
            uVar16 = right[2].type.id;
            cVar15 = '\x01';
            if (uVar17 == uVar16) {
              cVar15 = '[';
              bVar20 = uVar17 != 0;
              if (bVar20) {
                uVar13 = 1;
                uVar14 = 0;
                do {
                  if (uVar16 <= uVar14) goto LAB_006aae90;
                  if (*(long *)(*(long *)(left + 2) + 8 + uVar14 * 0x10) !=
                      *(long *)(*(long *)(right + 2) + 8 + uVar14 * 0x10)) {
                    cVar15 = '\x01';
                    break;
                  }
                  uVar14 = (ulong)uVar13;
                  uVar13 = uVar13 + 1;
                  bVar20 = uVar14 < uVar17;
                } while (uVar14 < uVar17);
              }
              if (!bVar20) {
                cVar15 = (left[1].type.id == right[1].type.id) + '\x01';
              }
            }
          }
          goto LAB_006aad1b;
        }
      }
    }
LAB_006aad15:
    cVar15 = '\x01';
LAB_006aad1b:
    if (cVar15 == '\x01') {
      return false;
    }
    return true;
  case StackSwitchId:
    if ((IVar3 == StackSwitchId) && (IVar4 == StackSwitchId)) {
      local_38 = (_Base_ptr)((long)this + 0x30);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_38,
                 (value_type *)(left + 4));
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 ((long)this + 0x48),(value_type *)(right + 4));
      uVar18 = left[2].type.id;
      if (uVar18 != right[2].type.id) {
        return false;
      }
      if (uVar18 != 0) {
        uVar17 = 0;
        do {
          if (left[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(left + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x38);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x40)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_38,iVar5
                       ,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x38) = *(long *)((long)this + 0x38) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      uVar18 = right[2].type.id;
      if (uVar18 != 0) {
        uVar17 = 0;
        do {
          if (right[2].type.id <= uVar17) goto LAB_006aae5a;
          p_Stack_48 = *(_Base_ptr *)(*(long *)(right + 2) + uVar17 * 8);
          iVar5._M_current = *(Expression ***)((long)this + 0x50);
          if (iVar5._M_current == *(Expression ***)((long)this + 0x58)) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                       ((long)this + 0x48),iVar5,(Expression **)&stack0xffffffffffffffb8);
          }
          else {
            *iVar5._M_current = (Expression *)p_Stack_48;
            *(long *)((long)this + 0x50) = *(long *)((long)this + 0x50) + 8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      goto LAB_006aa187;
    }
    pcVar11 = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
    break;
  default:
    return true;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,pcVar11);
LAB_006aae79:
  pcVar11 = 
  "T &ArenaVectorBase<ArenaVector<wasm::Type>, wasm::Type>::operator[](size_t) const [SubType = ArenaVector<wasm::Type>, T = wasm::Type]"
  ;
  goto LAB_006aae6f;
LAB_006aae5a:
  pcVar11 = 
  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
  ;
LAB_006aae6f:
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,pcVar11);
}

Assistant:

bool compareNodes(Expression* left, Expression* right) {
      if (left->_id != right->_id) {
        return false;
      }

#define DELEGATE_ID left->_id

// Create cast versions of it for later operations.
#define DELEGATE_START(id)                                                     \
  [[maybe_unused]] auto* castLeft = left->cast<id>();                          \
  [[maybe_unused]] auto* castRight = right->cast<id>();

// Handle each type of field, comparing it appropriately.
#define DELEGATE_FIELD_CHILD(id, field)                                        \
  leftStack.push_back(castLeft->field);                                        \
  rightStack.push_back(castRight->field);

#define DELEGATE_FIELD_CHILD_VECTOR(id, field)                                 \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (auto* child : castLeft->field) {                                        \
    leftStack.push_back(child);                                                \
  }                                                                            \
  for (auto* child : castRight->field) {                                       \
    rightStack.push_back(child);                                               \
  }

#define COMPARE_FIELD(field)                                                   \
  if (castLeft->field != castRight->field) {                                   \
    return false;                                                              \
  }

#define DELEGATE_FIELD_INT(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_LITERAL(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_NAME(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_TYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_HEAPTYPE(id, field) COMPARE_FIELD(field)
#define DELEGATE_FIELD_ADDRESS(id, field) COMPARE_FIELD(field)

#define COMPARE_LIST(field)                                                    \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (castLeft->field[i] != castRight->field[i]) {                           \
      return false;                                                            \
    }                                                                          \
  }

#define DELEGATE_FIELD_INT_ARRAY(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_INT_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field) COMPARE_LIST(field)
#define DELEGATE_FIELD_TYPE_VECTOR(id, field) COMPARE_LIST(field)

#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)                               \
  if (castLeft->field.is() != castRight->field.is()) {                         \
    return false;                                                              \
  }                                                                            \
  rightNames[castLeft->field] = castRight->field;

#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)                               \
  if (!compareNames(castLeft->field, castRight->field)) {                      \
    return false;                                                              \
  }

#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)                        \
  if (castLeft->field.size() != castRight->field.size()) {                     \
    return false;                                                              \
  }                                                                            \
  for (Index i = 0; i < castLeft->field.size(); i++) {                         \
    if (!compareNames(castLeft->field[i], castRight->field[i])) {              \
      return false;                                                            \
    }                                                                          \
  }

#include "wasm-delegations-fields.def"

      return true;
    }